

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O0

void __thiscall QGroupBox::focusInEvent(QGroupBox *this,QFocusEvent *fe)

{
  FocusPolicy FVar1;
  QWidget *in_RDI;
  QGroupBoxPrivate *unaff_retaddr;
  QGroupBoxPrivate *d;
  QFocusEvent *in_stack_ffffffffffffffd8;
  QWidget *pQVar2;
  FocusReason reason;
  
  pQVar2 = in_RDI;
  d_func((QGroupBox *)0x5a4c41);
  reason = (FocusReason)((ulong)pQVar2 >> 0x20);
  FVar1 = QWidget::focusPolicy(in_RDI);
  if (FVar1 == NoFocus) {
    QFocusEvent::reason();
    QGroupBoxPrivate::_q_fixFocus(unaff_retaddr,reason);
  }
  else {
    QWidget::focusInEvent(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QGroupBox::focusInEvent(QFocusEvent *fe)
{ // note no call to super
    Q_D(QGroupBox);
    if (focusPolicy() == Qt::NoFocus) {
        d->_q_fixFocus(fe->reason());
    } else {
        QWidget::focusInEvent(fe);
    }
}